

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

float __thiscall pbrt::MIPMap::Lookup<float>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  size_t sVar2;
  int level;
  Float FVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  initializer_list<float> __l;
  Vector2f local_48;
  undefined1 local_28 [16];
  
  auVar13._8_56_ = in_register_00001248;
  auVar13._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar6 = auVar9._0_16_;
  auVar11 = auVar13._0_16_;
  if ((this->options).filter == EWA) {
    auVar7._0_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.x *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar7._4_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.y *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar7._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
    auVar7._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
    auVar14._0_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar14._4_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar14._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
    auVar14._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
    auVar7 = vhaddps_avx(auVar7,auVar7);
    auVar14 = vhaddps_avx(auVar14,auVar14);
    auVar15 = auVar11;
    if (auVar14._0_4_ <= auVar7._0_4_) {
      auVar15 = auVar6;
      auVar6 = auVar11;
    }
    dst1_00 = auVar6._0_8_;
    auVar11 = vinsertps_avx(auVar6,auVar15,0x1c);
    auVar7 = vinsertps_avx(auVar15,auVar6,0x4c);
    auVar8._0_4_ = auVar11._0_4_ * auVar11._0_4_ + auVar7._0_4_ * auVar7._0_4_;
    auVar8._4_4_ = auVar11._4_4_ * auVar11._4_4_ + auVar7._4_4_ * auVar7._4_4_;
    auVar8._8_4_ = auVar11._8_4_ * auVar11._8_4_ + auVar7._8_4_ * auVar7._8_4_;
    auVar8._12_4_ = auVar11._12_4_ * auVar11._12_4_ + auVar7._12_4_ * auVar7._12_4_;
    auVar7 = vsqrtps_avx(auVar8);
    fVar4 = auVar7._0_4_;
    fVar10 = fVar4 * (this->options).maxAnisotropy;
    auVar11 = vinsertps_avx(auVar7,ZEXT416((uint)fVar10),0x1d);
    uVar1 = vcmpps_avx512vl(auVar11,auVar7,1);
    if ((~(ushort)uVar1 & 3) == 0) {
      auVar11 = vmovshdup_avx(auVar7);
      fVar10 = auVar11._0_4_ / fVar10;
      fVar4 = fVar4 * fVar10;
      dst1_00.x = auVar6._0_4_ * fVar10;
      dst1_00.y = auVar6._4_4_ * fVar10;
    }
    if ((fVar4 == 0.0) && (!NAN(fVar4))) {
      FVar3 = Bilerp<float>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
      return FVar3;
    }
    sVar2 = (this->pyramid).nStored;
    FVar3 = Log2(fVar4);
    auVar11 = vmaxss_avx(ZEXT416((uint)(FVar3 + (float)((int)sVar2 + -1))),ZEXT416(0));
    auVar6 = vroundss_avx(auVar11,auVar11,9);
    level = (int)auVar6._0_4_;
    auVar12._0_4_ = (int)auVar6._0_4_;
    auVar12._4_4_ = (int)auVar6._4_4_;
    auVar12._8_4_ = (int)auVar6._8_4_;
    auVar12._12_4_ = (int)auVar6._12_4_;
    auVar6 = vcvtdq2ps_avx(auVar12);
    fVar10 = auVar11._0_4_ - auVar6._0_4_;
    local_48.super_Tuple2<pbrt::Vector2,_float> = auVar15._0_8_;
    fVar4 = EWA<float>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_48,
                       (Vector2f)dst1_00);
    fVar5 = EWA<float>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_48,
                       (Vector2f)dst1_00);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar10)),ZEXT416((uint)fVar4),
                             ZEXT416((uint)(1.0 - fVar10)));
    fVar10 = auVar6._0_4_;
  }
  else {
    auVar6 = vmovlhps_avx(auVar6,auVar11);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    local_28 = vandps_avx512vl(auVar6,auVar11);
    __l._M_len = 4;
    __l._M_array = (iterator)local_28;
    fVar10 = std::max<float>(__l);
    fVar10 = Lookup<float>(this,st,fVar10 + fVar10);
  }
  return fVar10;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}